

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkScrew.cpp
# Opt level: O2

void __thiscall chrono::ChLinkScrew::ChLinkScrew(ChLinkScrew *this)

{
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkLock_011660a0;
  this->tau = 0.007957747154594767;
  ChLinkMaskLF::SetLockMask(&(this->super_ChLinkLock).mask,true,true,true,false,true,true,false);
  ChLinkLock::BuildLink(&this->super_ChLinkLock);
  return;
}

Assistant:

ChLinkScrew::ChLinkScrew() {
    Set_thread(0.05);

    // Mask: initialize our LinkMaskLF (lock formulation mask) to X,Y,Z,Rx Ry,
    // (note: the Z lock is not a standard LinkLock z-lock and will be handled as a custom screw constraint
    // z = tau*alpha, later in the updating functions).
    mask.SetLockMask(true, true, true, false, true, true, false);
    BuildLink();
}